

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
* __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_or_upsert<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
          (pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
           *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,transaction_base *transaction,
          pair<pstore::uint128,_pstore::extent<unsigned_char>_> *value,bool is_upsert)

{
  uint uVar1;
  database *this_00;
  hash_type hash;
  index_pointer node;
  bool bVar2;
  uint uVar3;
  address aVar4;
  reference value_00;
  pair<pstore::index::details::index_pointer,_bool> pVar5;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_2e0;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_2d8;
  database *local_2d0;
  undefined1 local_2c8 [216];
  hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  *local_1f0;
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  local_1e8;
  parent_stack parents;
  parent_stack reverse_parents;
  
  this_00 = transaction->db_;
  uVar1 = *(uint *)(this + 0x10);
  uVar3 = database::get_current_revision(this_00);
  if (uVar1 == uVar3) {
    memset(&parents,0,0xd8);
    bVar2 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::empty((hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                     *)this);
    local_2d0 = this_00;
    local_1f0 = this;
    if (bVar2) {
      local_2d8.ptr_ = &parents;
      gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
      ensure_invariant(&local_2d8);
      aVar4 = store_leaf_node<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                        (this,transaction,value,local_2d8);
      *(value_type *)(this + 0x18) = aVar4.a_;
      *(undefined8 *)(this + 0x20) = 1;
      memcpy(local_2c8,&parents,0xd8);
      (__return_storage_ptr__->first).db_ = this_00;
      memcpy(&(__return_storage_ptr__->first).visited_parents_,&parents,0xd8);
      (__return_storage_ptr__->first).index_ =
           (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            *)this;
      (__return_storage_ptr__->first).pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
      ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
      __return_storage_ptr__->second = true;
    }
    else {
      memset(&reverse_parents,0,0xd8);
      hash = *(hash_type *)((long)&(value->first).v_ + 8);
      node = *(index_pointer *)(this + 0x18);
      local_2e0.ptr_ = &reverse_parents;
      gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
      ensure_invariant(&local_2e0);
      pVar5 = insert_node<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                        (this,transaction,node,value,hash,0,local_2e0,is_upsert);
      *(index_pointer *)(this + 0x18) = pVar5.first;
      while (reverse_parents.elements_ != 0) {
        value_00 = array_stack<pstore::index::details::parent_type,_13UL>::top(&reverse_parents);
        array_stack<pstore::index::details::parent_type,_13UL>::push(&parents,value_00);
        array_stack<pstore::index::details::parent_type,_13UL>::pop(&reverse_parents);
      }
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      }
      memcpy(local_2c8,&parents,0xd8);
      (__return_storage_ptr__->first).db_ = this_00;
      memcpy(&(__return_storage_ptr__->first).visited_parents_,&parents,0xd8);
      (__return_storage_ptr__->first).index_ =
           (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            *)this;
      (__return_storage_ptr__->first).pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
      ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
      __return_storage_ptr__->second = (bool)(pVar5.second ^ 1);
    }
    local_1e8._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
            )0x0;
    std::
    unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ::~unique_ptr(&local_1e8);
    return __return_storage_ptr__;
  }
  raise<pstore::error_code>(index_not_latest_revision);
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_or_upsert (
            transaction_base & transaction, OtherValueType const & value, bool is_upsert)
            -> std::pair<iterator, bool> {

            database & db = transaction.db ();
            if (revision_ != db.get_current_revision ()) {
                raise (error_code::index_not_latest_revision);
            }

            parent_stack parents;
            if (this->empty ()) {
                root_ = this->store_leaf_node (transaction, value, &parents);
                size_ = 1;
                return std::make_pair (iterator (db, std::move (parents), this), true);
            }

            parent_stack reverse_parents;
            bool key_exists = false;
            auto hash = static_cast<hash_type> (hash_ (value.first));
            std::tie (root_, key_exists) = this->insert_node (
                transaction, root_, value, hash, 0 /* shifts */, &reverse_parents, is_upsert);
            while (!reverse_parents.empty ()) {
                parents.push (reverse_parents.top ());
                reverse_parents.pop ();
            }
            if (!key_exists) {
                ++size_;
            }
            return std::make_pair (iterator (db, std::move (parents), this), !key_exists);
        }